

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

void * crnd::crnd_default_realloc
                 (void *p,size_t size,size_t *pActual_size,bool movable,void *param_5)

{
  size_t sVar1;
  size_t local_48;
  void *local_40;
  void *p_final_block;
  void *p_new;
  void *param_4_local;
  bool movable_local;
  size_t *pActual_size_local;
  size_t size_local;
  void *p_local;
  
  if (p == (void *)0x0) {
    p_final_block = malloc(size);
    if (pActual_size != (size_t *)0x0) {
      if (p_final_block == (void *)0x0) {
        local_48 = 0;
      }
      else {
        local_48 = malloc_usable_size(p_final_block);
      }
      *pActual_size = local_48;
    }
  }
  else if (size == 0) {
    free(p);
    p_final_block = (void *)0x0;
    if (pActual_size != (size_t *)0x0) {
      *pActual_size = 0;
    }
  }
  else {
    p_final_block = (void *)0x0;
    local_40 = p;
    if ((movable) && (p_final_block = realloc(p,size), local_40 = p, p_final_block != (void *)0x0))
    {
      local_40 = p_final_block;
    }
    if (pActual_size != (size_t *)0x0) {
      sVar1 = malloc_usable_size(local_40);
      *pActual_size = sVar1;
    }
  }
  return p_final_block;
}

Assistant:

static void* crnd_default_realloc(void* p, size_t size, size_t* pActual_size, bool movable, void*) {
  void* p_new;

  if (!p) {
    p_new = ::malloc(size);

    if (pActual_size) {
#ifdef WIN32
      *pActual_size = p_new ? ::_msize(p_new) : 0;
#else
      *pActual_size = p_new ? malloc_usable_size(p_new) : 0;
#endif
    }
  } else if (!size) {
    ::free(p);
    p_new = NULL;

    if (pActual_size)
      *pActual_size = 0;
  } else {
    void* p_final_block = p;
#ifdef WIN32
    p_new = ::_expand(p, size);
#else
    p_new = NULL;
#endif

    if (p_new)
      p_final_block = p_new;
    else if (movable) {
      p_new = ::realloc(p, size);

      if (p_new)
        p_final_block = p_new;
    }

    if (pActual_size) {
#ifdef WIN32
      *pActual_size = ::_msize(p_final_block);
#else
      *pActual_size = ::malloc_usable_size(p_final_block);
#endif
    }
  }

  return p_new;
}